

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

CidrRange *
kj::CidrRange::inet6
          (CidrRange *__return_storage_ptr__,ArrayPtr<const_unsigned_short> prefix,
          ArrayPtr<const_unsigned_short> suffix,uint bitCount)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  unsigned_short *puVar5;
  ArrayPtr<const_unsigned_char> local_110;
  size_t local_100;
  size_t i_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  Range<unsigned_long> *__range1_1;
  byte *suffixBits;
  size_t i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  byte bits [16];
  Fault local_78;
  Fault f;
  unsigned_long local_68;
  DebugExpression<unsigned_long> local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  undefined1 auStack_28 [4];
  uint bitCount_local;
  ArrayPtr<const_unsigned_short> suffix_local;
  ArrayPtr<const_unsigned_short> prefix_local;
  
  suffix_local.ptr = (unsigned_short *)suffix.size_;
  _auStack_28 = suffix.ptr;
  suffix_local.size_ = (size_t)prefix.ptr;
  _kjCondition._36_4_ = bitCount;
  sVar2 = ArrayPtr<const_unsigned_short>::size
                    ((ArrayPtr<const_unsigned_short> *)&suffix_local.size_);
  sVar3 = ArrayPtr<const_unsigned_short>::size((ArrayPtr<const_unsigned_short> *)auStack_28);
  local_68 = sVar2 + sVar3;
  local_60 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_68);
  f.exception._4_4_ = 8;
  kj::_::DebugExpression<unsigned_long>::operator<=
            ((DebugComparison<unsigned_long,_int> *)local_58,&local_60,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
               ,0x5c,FAILED,"prefix.size() + suffix.size() <= 8","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_58);
    kj::_::Debug::Fault::fatal(&local_78);
  }
  memset(&__range1,0,0x10);
  ___begin1 = indices<kj::ArrayPtr<unsigned_short_const>&>
                        ((ArrayPtr<const_unsigned_short> *)&suffix_local.size_);
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    sVar2 = *puVar4;
    puVar5 = ArrayPtr<const_unsigned_short>::operator[]
                       ((ArrayPtr<const_unsigned_short> *)&suffix_local.size_,sVar2);
    bits[sVar2 * 2 + -8] = (byte)(*puVar5 >> 8);
    puVar5 = ArrayPtr<const_unsigned_short>::operator[]
                       ((ArrayPtr<const_unsigned_short> *)&suffix_local.size_,sVar2);
    bits[sVar2 * 2 + -7] = (byte)*puVar5;
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  sVar2 = ArrayPtr<const_unsigned_short>::size((ArrayPtr<const_unsigned_short> *)auStack_28);
  ___begin1_1 = indices<kj::ArrayPtr<unsigned_short_const>&>
                          ((ArrayPtr<const_unsigned_short> *)auStack_28);
  __end1_1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1_1);
  i_1 = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1_1);
  while( true ) {
    bVar1 = Range<unsigned_long>::Iterator::operator==(&__end1_1,(Iterator *)&i_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1_1);
    local_100 = *puVar4;
    puVar5 = ArrayPtr<const_unsigned_short>::operator[]
                       ((ArrayPtr<const_unsigned_short> *)auStack_28,local_100);
    bits[local_100 * 2 + sVar2 * -2 + 8] = (byte)(*puVar5 >> 8);
    puVar5 = ArrayPtr<const_unsigned_short>::operator[]
                       ((ArrayPtr<const_unsigned_short> *)auStack_28,local_100);
    bits[local_100 * 2 + sVar2 * -2 + 9] = (byte)*puVar5;
    Range<unsigned_long>::Iterator::operator++(&__end1_1);
  }
  ArrayPtr<unsigned_char_const>::ArrayPtr<16ul>
            ((ArrayPtr<unsigned_char_const> *)&local_110,(uchar (*) [16])&__range1);
  CidrRange(__return_storage_ptr__,10,local_110,_kjCondition._36_4_);
  return __return_storage_ptr__;
}

Assistant:

CidrRange CidrRange::inet6(
    ArrayPtr<const uint16_t> prefix, ArrayPtr<const uint16_t> suffix,
    uint bitCount) {
  KJ_REQUIRE(prefix.size() + suffix.size() <= 8);

  byte bits[16] = { 0,0,0,0, 0,0,0,0, 0,0,0,0, 0,0,0,0, };

  for (size_t i: kj::indices(prefix)) {
    bits[i * 2] = prefix[i] >> 8;
    bits[i * 2 + 1] = prefix[i] & 0xff;
  }

  byte* suffixBits = bits + (16 - suffix.size() * 2);
  for (size_t i: kj::indices(suffix)) {
    suffixBits[i * 2] = suffix[i] >> 8;
    suffixBits[i * 2 + 1] = suffix[i] & 0xff;
  }

  return CidrRange(AF_INET6, bits, bitCount);
}